

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  fpclass_type fVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  pointer pnVar17;
  long lVar18;
  type t;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  iVar12 = (rhs->super_IdxSet).len;
  *(int *)(this + 0xc) = iVar12;
  spx_realloc<int*>((int **)(this + 0x10),iVar12);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(this + 0x20),
          (int)((ulong)((long)(rhs->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rhs->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,true);
  *(element_type **)(this + 0x40) =
       (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48),
             &(rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (rhs->setupStatus == true) {
    IdxSet::operator=((IdxSet *)this,&rhs->super_IdxSet);
    if (0 < (long)*(int *)(this + 8)) {
      uVar14 = (long)*(int *)(this + 8) + 1;
      do {
        lVar15 = (long)(*(int **)(this + 0x10))[uVar14 - 2];
        pnVar17 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar15 * 0x50;
        lVar18 = *(long *)(this + 0x20);
        uVar5 = *(undefined8 *)&pnVar17[lVar15].m_backend.data;
        uVar6 = *(undefined8 *)((long)&pnVar17[lVar15].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar17[lVar15].m_backend.data + 0x10);
        uVar7 = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar17[lVar15].m_backend.data + 0x20);
        uVar9 = *(undefined8 *)puVar1;
        uVar10 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar17[lVar15].m_backend.data + 0x30);
        uVar11 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (undefined8 *)(lVar18 + 0x30 + lVar4);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar11;
        puVar2 = (undefined8 *)(lVar18 + 0x20 + lVar4);
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)(lVar18 + 0x10 + lVar4);
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        *(undefined8 *)(lVar18 + lVar4) = uVar5;
        ((undefined8 *)(lVar18 + lVar4))[1] = uVar6;
        *(int *)(lVar18 + 0x40 + lVar4) = pnVar17[lVar15].m_backend.exp;
        *(bool *)(lVar18 + 0x44 + lVar4) = pnVar17[lVar15].m_backend.neg;
        *(undefined8 *)(lVar18 + 0x48 + lVar4) = *(undefined8 *)&pnVar17[lVar15].m_backend.fpclass;
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
  }
  else {
    uVar16 = (int)((long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(rhs->
                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
    *(undefined4 *)(this + 8) = 0;
    if ((int)uVar16 < 1) {
      iVar12 = 0;
    }
    else {
      lVar18 = 0;
      uVar14 = 0;
      do {
        pnVar17 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar13 = cpp_dec_float_NaN;
        if (*(int *)((long)&(pnVar17->m_backend).data + lVar18 + 0x48) == 2) {
LAB_003eaaeb:
          local_d8.exp = *(int *)((long)&(pnVar17->m_backend).data + lVar18 + 0x40);
          local_d8.neg = *(bool *)((long)&(pnVar17->m_backend).data + lVar18 + 0x44);
          local_d8.prec_elem = *(int32_t *)((long)&(pnVar17->m_backend).data + lVar18 + 0x4c);
          puVar1 = (uint *)((long)&(pnVar17->m_backend).data + lVar18);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar17->m_backend).data + lVar18 + 0x10);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar17->m_backend).data + lVar18 + 0x20);
          local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar17->m_backend).data + lVar18 + 0x30);
          local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
          local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
          if ((local_d8.neg == true) &&
             (fVar13 != cpp_dec_float_finite || local_d8.data._M_elems[0] != 0)) {
            local_d8.neg = false;
          }
          local_d8.fpclass = fVar13;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_80,
                       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this);
          if (((local_d8.fpclass == cpp_dec_float_NaN) || (local_80.fpclass == cpp_dec_float_NaN))
             || (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_d8,&local_80), iVar12 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                      ((cpp_dec_float<100U,_int,_void> *)
                       ((long)&(((rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar18),0);
          }
          else {
            (rhs->super_IdxSet).idx[*(int *)(this + 8)] = (int)uVar14;
            *(int *)(*(long *)(this + 0x10) + (long)*(int *)(this + 8) * 4) = (int)uVar14;
            pnVar17 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar4 = *(long *)(this + 0x20);
            puVar2 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar18);
            uVar5 = *puVar2;
            uVar6 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x10);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x20);
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x30);
            uVar11 = puVar2[1];
            puVar3 = (undefined8 *)(lVar4 + 0x30 + lVar18);
            *puVar3 = *puVar2;
            puVar3[1] = uVar11;
            puVar2 = (undefined8 *)(lVar4 + 0x20 + lVar18);
            *puVar2 = uVar9;
            puVar2[1] = uVar10;
            puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar18);
            *puVar2 = uVar7;
            puVar2[1] = uVar8;
            *(undefined8 *)(lVar4 + lVar18) = uVar5;
            ((undefined8 *)(lVar4 + lVar18))[1] = uVar6;
            *(undefined4 *)(lVar4 + 0x40 + lVar18) =
                 *(undefined4 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x40);
            *(undefined1 *)(lVar4 + 0x44 + lVar18) =
                 *(undefined1 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x44);
            *(undefined8 *)(lVar4 + 0x48 + lVar18) =
                 *(undefined8 *)((long)&(pnVar17->m_backend).data + lVar18 + 0x48);
            *(int *)(this + 8) = *(int *)(this + 8) + 1;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&local_d8,0,(type *)0x0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)
                              ((long)&(pnVar17->m_backend).data + lVar18),&local_d8);
          if (iVar12 != 0) {
            pnVar17 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar13 = *(fpclass_type *)((long)&(pnVar17->m_backend).data + lVar18 + 0x48);
            goto LAB_003eaaeb;
          }
        }
        uVar14 = uVar14 + 1;
        lVar18 = lVar18 + 0x50;
      } while ((uVar16 & 0x7fffffff) != uVar14);
      iVar12 = *(int *)(this + 8);
    }
    (rhs->super_IdxSet).num = iVar12;
    rhs->setupStatus = true;
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return;
}

Assistant:

void setup_and_assign(SSVectorBase<S>& rhs)
   {
      clear();
      setMax(rhs.max());
      VectorBase<R>::reDim(rhs.dim());
      _tolerances = rhs.tolerances();

      if(rhs.isSetup())
      {
         IdxSet::operator=(rhs);

         for(int i = size() - 1; i >= 0; --i)
         {
            int j  = index(i);
            VectorBase<R>::val[j] = rhs.val[j];
         }
      }
      else
      {
         int d = rhs.dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(rhs.val[i] != 0)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  rhs.idx[num] = i;
                  idx[num] = i;
                  VectorBase<R>::val[i] = rhs.val[i];
                  num++;
               }
               else
                  rhs.val[i] = 0;
            }
         }

         rhs.num = num;
         rhs.setupStatus = true;
      }

      setupStatus = true;

      assert(rhs.isConsistent());
      assert(isConsistent());
   }